

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogTcpServer.cpp
# Opt level: O1

void __thiscall liblogger::LogTcpServer::~LogTcpServer(LogTcpServer *this)

{
  list<int,_std::allocator<int>_> *plVar1;
  size_t *psVar2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  int iVar5;
  ssize_t sVar6;
  char value;
  void *ret;
  undefined1 local_21;
  void *local_20;
  
  (this->super_ILogger)._vptr_ILogger = (_func_int **)&PTR__LogTcpServer_00146938;
  if (this->m_running == true) {
    local_21 = 0x51;
    sVar6 = write(this->m_ctlfd[1],&local_21,1);
    if (sVar6 != 1) goto LAB_00136479;
    local_20 = (void *)0x0;
    iVar5 = pthread_join(this->m_thread,&local_20);
    if (iVar5 != 0) goto LAB_00136479;
    this->m_running = false;
  }
  plVar1 = &this->m_list;
  while (p_Var3 = (this->m_list).super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                  super__List_node_base._M_next, p_Var3 != (_List_node_base *)plVar1) {
    iVar5 = close(*(int *)&p_Var3[1]._M_next);
    if (iVar5 < 0) goto LAB_00136479;
    p_Var3 = (this->m_list).super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
             super__List_node_base._M_next;
    psVar2 = &(this->m_list).super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size;
    *psVar2 = *psVar2 - 1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(p_Var3,0x18);
  }
  if ((((this->m_acceptfd < 0) || (iVar5 = close(this->m_acceptfd), -1 < iVar5)) &&
      ((this->m_ctlfd[0] < 0 || (iVar5 = close(this->m_ctlfd[0]), -1 < iVar5)))) &&
     (((this->m_ctlfd[1] < 0 || (iVar5 = close(this->m_ctlfd[1]), -1 < iVar5)) &&
      (iVar5 = pthread_mutex_destroy((pthread_mutex_t *)&this->m_mutex), iVar5 == 0)))) {
    p_Var3 = (plVar1->super__List_base<int,_std::allocator<int>_>)._M_impl._M_node.
             super__List_node_base._M_next;
    while (p_Var3 != (_List_node_base *)plVar1) {
      p_Var4 = p_Var3->_M_next;
      operator_delete(p_Var3,0x18);
      p_Var3 = p_Var4;
    }
    return;
  }
LAB_00136479:
  abort();
}

Assistant:

LogTcpServer::~LogTcpServer()
{
	if (m_running)
	{
		char value = 'Q';

		if (write(m_ctlfd[1], &value, sizeof(value)) != sizeof(value))
		{
			abort();
		}

		void *ret = NULL;
		if (pthread_join(m_thread, &ret) != 0)
		{
			abort();
		}
		m_running = false;
	}

	//No background thread. So no locking required from this point on

	while(!m_list.empty())
	{
		int fd = m_list.front();
		if (close(fd) < 0)
			abort();
		m_list.pop_front();
	}

	if (m_acceptfd >= 0)
	{
		if (close(m_acceptfd) < 0)
		{
			abort();
		}
	}

	if (m_ctlfd[0] >= 0)
	{
		if (close(m_ctlfd[0]) < 0)
		{
			abort();
		}
	}

	if (m_ctlfd[1] >= 0)
	{
		if (close(m_ctlfd[1]) < 0)
		{
			abort();
		}
	}

	if (pthread_mutex_destroy(&m_mutex) != 0)
		abort();

}